

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O3

ostream * spvtools::utils::operator<<(ostream *os,FloatProxy<double> *value)

{
  undefined8 uVar1;
  HexFloat<spvtools::utils::FloatProxy<double>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>_>_>
  local_18;
  
  local_18.value_.data_ = (FloatProxy<double>)value->data_;
  if ((((double)local_18.value_.data_ == 0.0) && (!NAN((double)local_18.value_.data_))) ||
     ((!NAN((double)local_18.value_.data_) &&
      ((uint)((ulong)((long)ABS((double)local_18.value_.data_) + -0x10000000000000) >> 0x35) < 0x3ff
      )))) {
    uVar1 = *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 8);
    *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 8) = 0x11;
    std::ostream::_M_insert<double>((double)local_18.value_.data_);
    *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 8) = uVar1;
  }
  else {
    operator<<(os,&local_18);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const FloatProxy<T>& value) {
  auto float_val = value.getAsFloat();
  switch (std::fpclassify(float_val)) {
    case FP_ZERO:
    case FP_NORMAL: {
      auto saved_precision = os.precision();
      os.precision(std::numeric_limits<T>::max_digits10);
      os << float_val;
      os.precision(saved_precision);
    } break;
    default:
      os << HexFloat<FloatProxy<T>>(value);
      break;
  }
  return os;
}